

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O2

void __thiscall Gnuplot::~Gnuplot(Gnuplot *this)

{
  GnuplotException *this_00;
  int iVar1;
  string local_38;
  allocator local_11;
  
  iVar1 = pclose((FILE *)this->gnucmd);
  if (iVar1 != -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&this->tmpfile_list);
    std::__cxx11::string::~string((string *)&this->smooth);
    std::__cxx11::string::~string((string *)&this->pstyle);
    return;
  }
  this_00 = (GnuplotException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Problem closing communication to gnuplot",&local_11);
  GnuplotException::GnuplotException(this_00,&local_38);
  __cxa_throw(this_00,&GnuplotException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Gnuplot::~Gnuplot() {
//  remove_tmpfiles();
// A stream opened by popen() should be closed by pclose()
// #if defined(WIN32) || defined(_WIN32) || defined(__WIN32__) || defined(__TOS_WIN__)
//  if (_pclose(gnucmd) == -1)
 #if defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
    if (pclose(gnucmd) == -1)
 #endif
    throw GnuplotException("Problem closing communication to gnuplot");
}